

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

absolute_lookup * __thiscall
absl::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          Transition *tr)

{
  byte bVar1;
  pointer pTVar2;
  fields fVar3;
  
  bVar1 = tr->type_index;
  pTVar2 = (this->transition_types_).
           super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar3 = (fields)detail::operator+((civil_time<absl::time_internal::cctz::detail::second_tag>)
                                    (tr->civil_sec).f_,unix_time - tr->unix_time);
  (__return_storage_ptr__->cs).f_ = fVar3;
  __return_storage_ptr__->offset = pTVar2[bVar1].utc_offset;
  __return_storage_ptr__->is_dst = pTVar2[bVar1].is_dst;
  __return_storage_ptr__->abbr = (this->abbreviations_)._M_dataplus._M_p + pTVar2[bVar1].abbr_index;
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(std::int_fast64_t unix_time,
                                                   const Transition& tr) const {
  const TransitionType& tt = transition_types_[tr.type_index];
  // Note: (unix_time - tr.unix_time) will never overflow as we
  // have ensured that there is always a "nearby" transition.
  return {tr.civil_sec + (unix_time - tr.unix_time),  // TODO: Optimize.
          tt.utc_offset, tt.is_dst, &abbreviations_[tt.abbr_index]};
}